

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

void __thiscall spvtools::opt::Loop::SetPreHeaderBlock(Loop *this,BasicBlock *preheader)

{
  Instruction *pIVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  const_iterator cVar4;
  key_type_conflict local_24;
  
  if (preheader != (BasicBlock *)0x0) {
    pIVar1 = (preheader->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar1->has_result_id_ == true) {
      Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
    }
    cVar4 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->loop_basic_blocks_)._M_h,&local_24);
    if (cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      __assert_fail("!IsInsideLoop(preheader) && \"The preheader block is in the loop\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x13e,"void spvtools::opt::Loop::SetPreHeaderBlock(BasicBlock *)");
    }
    pIVar1 = (preheader->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar1 == (Instruction *)0x0) ||
       ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    pIVar1 = (preheader->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
    if (pIVar1->opcode_ != OpBranch) {
      __assert_fail("preheader->tail()->opcode() == spv::Op::OpBranch && \"The preheader block does not unconditionally branch to the header \" \"block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x141,"void spvtools::opt::Loop::SetPreHeaderBlock(BasicBlock *)");
    }
    uVar3 = 0;
    uVar2 = Instruction::GetSingleWordOperand(pIVar1,0);
    pIVar1 = (this->loop_header_->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar1->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
    }
    if (uVar2 != uVar3) {
      __assert_fail("preheader->tail()->GetSingleWordOperand(0) == GetHeaderBlock()->id() && \"The preheader block does not unconditionally branch to the header \" \"block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x145,"void spvtools::opt::Loop::SetPreHeaderBlock(BasicBlock *)");
    }
  }
  this->loop_preheader_ = preheader;
  return;
}

Assistant:

void Loop::SetPreHeaderBlock(BasicBlock* preheader) {
  if (preheader) {
    assert(!IsInsideLoop(preheader) && "The preheader block is in the loop");
    assert(preheader->tail()->opcode() == spv::Op::OpBranch &&
           "The preheader block does not unconditionally branch to the header "
           "block");
    assert(preheader->tail()->GetSingleWordOperand(0) ==
               GetHeaderBlock()->id() &&
           "The preheader block does not unconditionally branch to the header "
           "block");
  }
  loop_preheader_ = preheader;
}